

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::UninterpretedOption::MergePartialFromCodedStream
          (UninterpretedOption *this,CodedInputStream *input)

{
  uint8 *puVar1;
  bool bVar2;
  uint uVar3;
  Type *value;
  string *psVar4;
  uint32 tag;
  uint64 temp;
  double local_40;
  uint64 *local_38;
  
  local_38 = &this->positive_int_value_;
LAB_001fa340:
  do {
    puVar1 = input->buffer_;
    if ((puVar1 < input->buffer_end_) && (tag = (uint32)(char)*puVar1, -1 < (char)*puVar1)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar1 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    uVar3 = tag & 7;
    switch(tag >> 3) {
    case 2:
      if (uVar3 == 2) {
        while( true ) {
          value = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                            (&(this->name_).super_RepeatedPtrFieldBase);
          bVar2 = internal::WireFormatLite::
                  ReadMessageNoVirtual<google::protobuf::UninterpretedOption_NamePart>(input,value);
          if (!bVar2) {
            return false;
          }
          puVar1 = input->buffer_;
          if (input->buffer_end_ <= puVar1) goto LAB_001fa340;
          if (*puVar1 != '\x12') break;
          input->buffer_ = puVar1 + 1;
        }
        if (*puVar1 == '\x1a') {
          input->buffer_ = puVar1 + 1;
LAB_001fa414:
          psVar4 = mutable_identifier_value_abi_cxx11_(this);
          bVar2 = internal::WireFormatLite::ReadString(input,psVar4);
          if (!bVar2) {
            return false;
          }
          internal::WireFormat::VerifyUTF8StringFallback
                    ((this->identifier_value_->_M_dataplus)._M_p,
                     (int)this->identifier_value_->_M_string_length,PARSE);
          puVar1 = input->buffer_;
          if ((puVar1 < input->buffer_end_) && (*puVar1 == ' ')) {
            input->buffer_ = puVar1 + 1;
LAB_001fa45e:
            bVar2 = io::CodedInputStream::ReadVarint64(input,local_38);
            if (!bVar2) {
              return false;
            }
            *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
            puVar1 = input->buffer_;
            if ((puVar1 < input->buffer_end_) && (*puVar1 == '(')) {
              input->buffer_ = puVar1 + 1;
LAB_001fa496:
              bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&local_40);
              if (!bVar2) {
                return false;
              }
              this->negative_int_value_ = (int64)local_40;
              *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
              puVar1 = input->buffer_;
              if ((puVar1 < input->buffer_end_) && (*puVar1 == '1')) {
                input->buffer_ = puVar1 + 1;
LAB_001fa4d7:
                bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&local_40);
                if (!bVar2) {
                  return false;
                }
                this->double_value_ = local_40;
                *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x10;
                puVar1 = input->buffer_;
                if ((puVar1 < input->buffer_end_) && (*puVar1 == ':')) {
                  input->buffer_ = puVar1 + 1;
LAB_001fa522:
                  psVar4 = mutable_string_value_abi_cxx11_(this);
                  bVar2 = internal::WireFormatLite::ReadBytes(input,psVar4);
                  if (!bVar2) {
                    return false;
                  }
                  puVar1 = input->buffer_;
                  if ((puVar1 < input->buffer_end_) && (*puVar1 == 'B')) {
                    input->buffer_ = puVar1 + 1;
LAB_001fa578:
                    psVar4 = mutable_aggregate_value_abi_cxx11_(this);
                    bVar2 = internal::WireFormatLite::ReadString(input,psVar4);
                    if (!bVar2) {
                      return false;
                    }
                    internal::WireFormat::VerifyUTF8StringFallback
                              ((this->aggregate_value_->_M_dataplus)._M_p,
                               (int)this->aggregate_value_->_M_string_length,PARSE);
                    bVar2 = io::CodedInputStream::ExpectAtEnd(input);
                    if (bVar2) {
                      return true;
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_001fa340;
      }
      break;
    case 3:
      if (uVar3 == 2) goto LAB_001fa414;
      break;
    case 4:
      if (uVar3 == 0) goto LAB_001fa45e;
      break;
    case 5:
      if (uVar3 == 0) goto LAB_001fa496;
      break;
    case 6:
      if (uVar3 == 1) goto LAB_001fa4d7;
      break;
    case 7:
      if (uVar3 == 2) goto LAB_001fa522;
      break;
    case 8:
      if (uVar3 == 2) goto LAB_001fa578;
    }
    if (uVar3 == 4) {
      return true;
    }
    bVar2 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool UninterpretedOption::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_name:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_name()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_name;
        if (input->ExpectTag(26)) goto parse_identifier_value;
        break;
      }

      // optional string identifier_value = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_identifier_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_identifier_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->identifier_value().data(), this->identifier_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(32)) goto parse_positive_int_value;
        break;
      }

      // optional uint64 positive_int_value = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_positive_int_value:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &positive_int_value_)));
          set_has_positive_int_value();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(40)) goto parse_negative_int_value;
        break;
      }

      // optional int64 negative_int_value = 5;
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_negative_int_value:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &negative_int_value_)));
          set_has_negative_int_value();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(49)) goto parse_double_value;
        break;
      }

      // optional double double_value = 6;
      case 6: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_FIXED64) {
         parse_double_value:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &double_value_)));
          set_has_double_value();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(58)) goto parse_string_value;
        break;
      }

      // optional bytes string_value = 7;
      case 7: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_string_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_string_value()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(66)) goto parse_aggregate_value;
        break;
      }

      // optional string aggregate_value = 8;
      case 8: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_aggregate_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_aggregate_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->aggregate_value().data(), this->aggregate_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}